

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O1

void __thiscall
vkt::tessellation::anon_unknown_2::IdentityTessellationShaderTestCase::initPrograms
          (IdentityTessellationShaderTestCase *this,SourceCollections *programCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TessPrimitiveType TVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  ProgramSources *pPVar9;
  char *pcVar10;
  long lVar11;
  ostringstream src;
  undefined1 auStack_218 [8];
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  uint local_1a8;
  undefined4 uStack_1a4;
  value_type local_1a0 [3];
  ios_base local_138 [264];
  
  addVertexAndFragmentShaders(programCollection);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pcVar6 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18)
                    + 0x70);
  }
  else {
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar6,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(vertices = ",0x12);
  iVar5 = numVerticesPerPrimitive(this->m_primitiveType,false);
  poVar8 = (ostream *)std::ostream::operator<<(&local_1a8,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") out;\n",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(location = 0) in  highp vec4 v_vertex_color[];\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(location = 0) out highp vec4 v_control_color[];\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n",0x4e)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    v_control_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n",0x48
            );
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    gl_TessLevelInner[0] = 1.0;\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    gl_TessLevelInner[1] = 1.0;\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    gl_TessLevelOuter[0] = 1.0;\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    gl_TessLevelOuter[1] = 1.0;\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    gl_TessLevelOuter[2] = 1.0;\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    gl_TessLevelOuter[3] = 1.0;\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
  paVar1 = &local_1f0.field_2;
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"tesc","");
  pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0._0_4_ = 3;
  pcVar6 = local_1c0._M_local_buf + 8;
  local_1d0._8_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1d0 + 8),local_210._M_dataplus._M_p,
             local_210._M_dataplus._M_p + local_210._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar9->sources + (local_1d0._0_8_ & 0xffffffff),(value_type *)(local_1d0 + 8));
  if ((char *)local_1d0._8_8_ != pcVar6) {
    operator_delete((void *)local_1d0._8_8_,local_1c0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  pcVar10 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18)
                    + 0x70);
  }
  else {
    sVar7 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"layout(",7);
  TVar3 = this->m_primitiveType;
  if (TVar3 == TESSPRIMITIVETYPE_TRIANGLES) {
    pcVar10 = "triangles";
LAB_007aaaf7:
    bVar4 = false;
  }
  else {
    if (TVar3 == TESSPRIMITIVETYPE_ISOLINES) {
      pcVar10 = "isolines";
      goto LAB_007aaaf7;
    }
    if (TVar3 == TESSPRIMITIVETYPE_QUADS) {
      pcVar10 = "quads";
      goto LAB_007aaaf7;
    }
    bVar4 = true;
    pcVar10 = (char *)0x0;
  }
  if (bVar4) {
    std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18)
                    + 0x70);
  }
  else {
    sVar7 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(location = 0) in  highp vec4 v_control_color[];\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"layout(location = 0) out highp vec4 v_evaluated_color;\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "// note: No need to use precise gl_Position since we do not require gapless geometry\n"
             ,0x55);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"{\n",2);
  if (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "    gl_Position = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);\n"
               ,0x53);
    lVar11 = 0x55;
    pcVar10 = 
    "    v_evaluated_color = mix(v_control_color[0], v_control_color[1], gl_TessCoord.x);\n";
  }
  else {
    if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) goto LAB_007aac4b;
    lVar11 = 0x89;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "    gl_Position = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n"
               ,0x89);
    pcVar10 = 
    "    v_evaluated_color = gl_TessCoord.x * v_control_color[0] + gl_TessCoord.y * v_control_color[1] + gl_TessCoord.z * v_control_color[2];\n"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,lVar11);
LAB_007aac4b:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"}\n",2);
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"tese","");
  pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  local_1d0._0_4_ = 4;
  local_1d0._8_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1d0 + 8),local_210._M_dataplus._M_p,
             local_210._M_dataplus._M_p + local_210._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar9->sources + (local_1d0._0_8_ & 0xffffffff),(value_type *)(local_1d0 + 8));
  if ((char *)local_1d0._8_8_ != pcVar6) {
    operator_delete((void *)local_1d0._8_8_,local_1c0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"geom_from_tese","");
  pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_1d0);
  TVar3 = this->m_primitiveType;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"v_evaluated_color","");
  generateGeometryShader(&local_1f0,TVar3,&local_210);
  local_1a8 = 2;
  paVar2 = &local_1a0[0].field_2;
  local_1a0[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar9->sources + local_1a8,local_1a0);
  paVar1 = &local_210.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  local_1d0._0_8_ = &local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"geom_from_vert","");
  pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_1d0);
  TVar3 = this->m_primitiveType;
  local_210._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"v_vertex_color","");
  generateGeometryShader(&local_1f0,TVar3,&local_210);
  local_1a8 = 2;
  local_1a0[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar9->sources + local_1a8,local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_,local_1c0._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void IdentityTessellationShaderTestCase::initPrograms (vk::SourceCollections& programCollection) const
{
	addVertexAndFragmentShaders(programCollection);

	// Tessellation control
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "layout(vertices = " << numVerticesPerPrimitive(m_primitiveType, false) << ") out;\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec4 v_vertex_color[];\n"
			<< "layout(location = 0) out highp vec4 v_control_color[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< "    v_control_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n"
			<< "\n"
			<< "    gl_TessLevelInner[0] = 1.0;\n"
			<< "    gl_TessLevelInner[1] = 1.0;\n"
			<< "    gl_TessLevelOuter[0] = 1.0;\n"
			<< "    gl_TessLevelOuter[1] = 1.0;\n"
			<< "    gl_TessLevelOuter[2] = 1.0;\n"
			<< "    gl_TessLevelOuter[3] = 1.0;\n"
			<<	"}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "layout(" << getTessPrimitiveTypeShaderName(m_primitiveType) << ") in;\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec4 v_control_color[];\n"
			<< "layout(location = 0) out highp vec4 v_evaluated_color;\n"
			<< "\n"
			<< "// note: No need to use precise gl_Position since we do not require gapless geometry\n"
			<< "void main (void)\n"
			<< "{\n";

		if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			src << "    gl_Position = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n"
				<< "    v_evaluated_color = gl_TessCoord.x * v_control_color[0] + gl_TessCoord.y * v_control_color[1] + gl_TessCoord.z * v_control_color[2];\n";
		else if (m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
			src << "    gl_Position = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);\n"
				<< "    v_evaluated_color = mix(v_control_color[0], v_control_color[1], gl_TessCoord.x);\n";
		else
			DE_ASSERT(false);

		src << "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}

	// Geometry shader
	{
		programCollection.glslSources.add("geom_from_tese") << glu::GeometrySource(
			generateGeometryShader(m_primitiveType, "v_evaluated_color"));
		programCollection.glslSources.add("geom_from_vert") << glu::GeometrySource(
			generateGeometryShader(m_primitiveType, "v_vertex_color"));
	}
}